

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O0

int WebRtcIsac_DecodeLpc(Bitstr *streamdata,double *LPCCoef_lo,double *LPCCoef_hi)

{
  int iVar1;
  int err;
  double lars [120];
  double *LPCCoef_hi_local;
  double *LPCCoef_lo_local;
  Bitstr *streamdata_local;
  
  lars[0x77] = (double)LPCCoef_hi;
  iVar1 = WebRtcIsac_DecodeLpcCoef(streamdata,(double *)&stack0xfffffffffffffc18);
  if (iVar1 < 0) {
    streamdata_local._4_4_ = -0x1a18;
  }
  else {
    WebRtcIsac_Lar2Poly((double *)&stack0xfffffffffffffc18,LPCCoef_lo,0xc,(double *)lars[0x77],6,6);
    streamdata_local._4_4_ = 0;
  }
  return streamdata_local._4_4_;
}

Assistant:

int WebRtcIsac_DecodeLpc(Bitstr* streamdata, double* LPCCoef_lo,
                         double* LPCCoef_hi) {
  double lars[KLT_ORDER_GAIN + KLT_ORDER_SHAPE];
  int err;

  err = WebRtcIsac_DecodeLpcCoef(streamdata, lars);
  if (err < 0) {
    return -ISAC_RANGE_ERROR_DECODE_LPC;
  }
  WebRtcIsac_Lar2Poly(lars, LPCCoef_lo, ORDERLO, LPCCoef_hi, ORDERHI,
                      SUBFRAMES);
  return 0;
}